

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O2

char * nullcDebugGetNativeAddressLocation(void *address,uint full)

{
  bool bVar1;
  uint instruction;
  OutputBuffer *pOVar2;
  
  instruction = nullcDebugConvertNativeAddressToInstruction(address);
  if (instruction == 0xffffffff) {
    if ((NULLC::executorX86 != (ExecutorX86 *)0x0 && NULLC::currExec == 1) &&
       (bVar1 = ExecutorX86::IsCodeLaunchHeader(NULLC::executorX86,address), bVar1)) {
      return "[Transition to nullc]";
    }
    pOVar2 = (OutputBuffer *)0x0;
  }
  else {
    nullcDebugGetVmAddressLocation(instruction,full);
    pOVar2 = &nullcDebugGetVmAddressLocation::buffer;
  }
  return pOVar2->buf;
}

Assistant:

const char* nullcDebugGetNativeAddressLocation(void *address, unsigned full)
{
	using namespace NULLC;

	unsigned instruction = nullcDebugConvertNativeAddressToInstruction(address);

	if(instruction == ~0u)
	{
#ifdef NULLC_BUILD_X86_JIT
		if(currExec == NULLC_X86 && executorX86 && executorX86->IsCodeLaunchHeader(address))
			return "[Transition to nullc]";
#endif

		return NULL;
	}

	return nullcDebugGetVmAddressLocation(instruction, full);
}